

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O3

void wasm::PostWalker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::scan
               (InitFixer *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  _func_void_InitFixer_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    wasm::handle_unreachable
              ("unexpected expression type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
               ,0x103);
  case BlockId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitBlock,currp);
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
LAB_00147d03:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                    ,0x31b,__function);
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) {
LAB_00147938:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
                  ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case IfId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitIf,currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_00147d03;
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer,wasm::Visitor<(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)((anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer,wasm::Visitor<(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer,void>>::Task,10ul>
                  *)&(self->super_PostWalker<InitFixer,_wasm::Visitor<InitFixer,_void>_>).
                     super_Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    goto LAB_00147781;
  case LoopId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitLoop,currp);
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_00147d03;
    }
    goto LAB_0014725c;
  case BreakId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitBreak,currp);
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_00147d03;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer,wasm::Visitor<(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)((anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer,wasm::Visitor<(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer,void>>::Task,10ul>
                  *)&(self->super_PostWalker<InitFixer,_wasm::Visitor<InitFixer,_void>_>).
                     super_Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_001470c0;
  case SwitchId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitSwitch,currp);
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_00147d03;
    }
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
               (Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar4 = *(long *)(pEVar1 + 4);
    goto joined_r0x001470ba;
  case CallId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitCall,currp);
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_00147d03;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_00147938;
        Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
                  ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case CallIndirectId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitCallIndirect,currp);
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_00147d03;
    }
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
               (Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 2) <= uVar3 - 2) goto LAB_00147938;
        Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
                  ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
                   (Expression **)(pEVar1[1].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case LocalGetId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitLocalGet,currp);
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_00147d03;
    }
    break;
  case LocalSetId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitLocalSet,currp);
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_00147d03;
    }
    goto LAB_00147873;
  case GlobalGetId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitGlobalGet,currp);
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_00147d03;
    }
    break;
  case GlobalSetId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitGlobalSet,currp);
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_00147d03;
    }
    goto LAB_0014725c;
  case LoadId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitLoad,currp);
    if (pEVar1->_id != LoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Load]";
      goto LAB_00147d03;
    }
    pEVar1 = pEVar1 + 3;
    goto LAB_00147881;
  case StoreId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitStore,currp);
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_00147d03;
    }
    goto LAB_00147520;
  case ConstId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitConst,currp);
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_00147d03;
    }
    break;
  case UnaryId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitUnary,currp);
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_00147d03;
    }
    goto LAB_00147873;
  case BinaryId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitBinary,currp);
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_00147d03;
    }
    goto LAB_001474b7;
  case SelectId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitSelect,currp);
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_00147d03;
    }
    goto LAB_00147772;
  case DropId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitDrop,currp);
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_00147d03;
    }
    goto LAB_00147318;
  case ReturnId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitReturn,currp);
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_00147d03;
    }
    goto LAB_001470b1;
  case MemorySizeId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitMemorySize,currp);
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_00147d03;
    }
    break;
  case MemoryGrowId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitMemoryGrow,currp);
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_00147d03;
    }
    goto LAB_00147318;
  case NopId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitNop,currp);
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_00147d03;
    }
    break;
  case UnreachableId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitUnreachable,currp);
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_00147d03;
    }
    break;
  case AtomicRMWId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitAtomicRMW,currp);
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_00147d03;
    }
    goto LAB_001475a3;
  case AtomicCmpxchgId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitAtomicCmpxchg,currp);
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_00147d03;
    }
    goto LAB_00147594;
  case AtomicWaitId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitAtomicWait,currp);
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_00147d03;
    }
    goto LAB_0014727d;
  case AtomicNotifyId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitAtomicNotify,currp);
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_00147d03;
    }
    goto LAB_001474b7;
  case AtomicFenceId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitAtomicFence,currp);
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_00147d03;
    }
    break;
  case SIMDExtractId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitSIMDExtract,currp);
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_00147d03;
    }
    goto LAB_00147873;
  case SIMDReplaceId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitSIMDReplace,currp);
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_00147d03;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_001474c2;
  case SIMDShuffleId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitSIMDShuffle,currp);
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_00147d03;
    }
    goto LAB_00147781;
  case SIMDTernaryId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitSIMDTernary,currp);
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_00147d03;
    }
    goto LAB_0014727d;
  case SIMDShiftId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitSIMDShift,currp);
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_00147d03;
    }
    goto LAB_001474b7;
  case SIMDLoadId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitSIMDLoad,currp);
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_00147d03;
    }
    goto LAB_0014743c;
  case SIMDLoadStoreLaneId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitSIMDLoadStoreLane,currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_00147d03;
    }
LAB_00147520:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
               (Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_00147881;
  case MemoryInitId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitMemoryInit,currp);
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_00147d03;
    }
    goto LAB_00147594;
  case DataDropId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitDataDrop,currp);
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_00147d03;
    }
    break;
  case MemoryCopyId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitMemoryCopy,currp);
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_00147d03;
    }
    goto LAB_00147772;
  case MemoryFillId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitMemoryFill,currp);
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_00147d03;
    }
    goto LAB_00147772;
  case PopId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitPop,currp);
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_00147d03;
    }
    break;
  case RefNullId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitRefNull,currp);
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_00147d03;
    }
    break;
  case RefIsNullId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitRefIsNull,currp);
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_00147d03;
    }
    goto LAB_00147318;
  case RefFuncId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitRefFunc,currp);
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_00147d03;
    }
    break;
  case RefEqId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitRefEq,currp);
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_00147d03;
    }
    goto LAB_00147781;
  case TableGetId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitTableGet,currp);
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_00147d03;
    }
    goto LAB_0014725c;
  case TableSetId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitTableSet,currp);
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_00147d03;
    }
    goto LAB_001475a3;
  case TableSizeId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitTableSize,currp);
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_00147d03;
    }
    break;
  case TableGrowId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitTableGrow,currp);
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_00147d03;
    }
    goto LAB_001475a3;
  case TableFillId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitTableFill,currp);
    if (pEVar1->_id != TableFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableFill]";
      goto LAB_00147d03;
    }
    goto LAB_00147594;
  case TableCopyId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitTableCopy,currp);
    if (pEVar1->_id != TableCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableCopy]";
      goto LAB_00147d03;
    }
    goto LAB_00147772;
  case TableInitId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitTableInit,currp);
    if (pEVar1->_id != TableInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableInit]";
      goto LAB_00147d03;
    }
    goto LAB_00147594;
  case TryId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitTry,currp);
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_00147d03;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (*(ulong *)(pEVar1 + 5) <= uVar3 - 2) goto LAB_00147938;
        Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
                  ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
                   (Expression **)(pEVar1[4].type.id + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
LAB_0014725c:
    pEVar1 = pEVar1 + 2;
    goto LAB_00147881;
  case TryTableId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitTryTable,currp);
    if (pEVar1->_id != TryTableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TryTable]";
      goto LAB_00147d03;
    }
    goto LAB_00147318;
  case ThrowId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitThrow,currp);
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_00147d03;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_00147938;
        Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
                  ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RethrowId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitRethrow,currp);
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_00147d03;
    }
    break;
  case ThrowRefId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitThrowRef,currp);
    if (pEVar1->_id != ThrowRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ThrowRef]";
      goto LAB_00147d03;
    }
    goto LAB_00147318;
  case TupleMakeId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitTupleMake,currp);
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_00147d03;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_00147938;
        Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
                  ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case TupleExtractId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitTupleExtract,currp);
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_00147d03;
    }
    goto LAB_00147318;
  case RefI31Id:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitRefI31,currp);
    if (pEVar1->_id != RefI31Id) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefI31]";
      goto LAB_00147d03;
    }
    goto LAB_00147318;
  case I31GetId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitI31Get,currp);
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_00147d03;
    }
    goto LAB_00147318;
  case CallRefId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitCallRef,currp);
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_00147d03;
    }
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_00147938;
        Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
                  ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case RefTestId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitRefTest,currp);
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_00147d03;
    }
    goto LAB_00147318;
  case RefCastId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitRefCast,currp);
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_00147d03;
    }
    goto LAB_00147318;
  case BrOnId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitBrOn,currp);
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_00147d03;
    }
LAB_0014743c:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_00147881;
  case StructNewId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitStructNew,currp);
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_00147d03;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_00147938;
        Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
                  ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case StructGetId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitStructGet,currp);
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_00147d03;
    }
    goto LAB_00147873;
  case StructSetId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitStructSet,currp);
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_00147d03;
    }
    goto LAB_001474b7;
  case StructRMWId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitStructRMW,currp);
    if (pEVar1->_id != StructRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructRMW]";
      goto LAB_00147d03;
    }
    goto LAB_001474b7;
  case StructCmpxchgId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitStructCmpxchg,currp);
    if (pEVar1->_id != StructCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructCmpxchg]";
      goto LAB_00147d03;
    }
LAB_0014727d:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
               (Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_001474c2;
  case ArrayNewId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitArrayNew,currp);
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_00147d03;
    }
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
               (Expression **)&pEVar1[1].type);
LAB_001470b1:
    local_38 = pEVar1 + 1;
    lVar4 = *(long *)(pEVar1 + 1);
joined_r0x001470ba:
    if (lVar4 != 0) {
LAB_001470c0:
      local_40 = scan;
      SmallVector<wasm::Walker<(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer,wasm::Visitor<(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)((anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer,wasm::Visitor<(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer,void>>::Task,10ul>
                  *)&(self->super_PostWalker<InitFixer,_wasm::Visitor<InitFixer,_void>_>).
                     super_Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    break;
  case ArrayNewDataId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitArrayNewData,currp);
    if (pEVar1->_id != ArrayNewDataId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewData]";
      goto LAB_00147d03;
    }
    goto LAB_001475a3;
  case ArrayNewElemId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitArrayNewElem,currp);
    if (pEVar1->_id != ArrayNewElemId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewElem]";
      goto LAB_00147d03;
    }
    goto LAB_001475a3;
  case ArrayNewFixedId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitArrayNewFixed,currp);
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_00147d03;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_00147938;
        Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
                  ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ArrayGetId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitArrayGet,currp);
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_00147d03;
    }
    goto LAB_00147781;
  case ArraySetId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitArraySet,currp);
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_00147d03;
    }
    goto LAB_00147772;
  case ArrayLenId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitArrayLen,currp);
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_00147d03;
    }
    goto LAB_00147318;
  case ArrayCopyId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitArrayCopy,currp);
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_00147d03;
    }
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    goto LAB_00147763;
  case ArrayFillId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitArrayFill,currp);
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_00147d03;
    }
LAB_00147763:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
               (Expression **)&pEVar1[2].type);
    goto LAB_00147772;
  case ArrayInitDataId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitArrayInitData,currp);
    if (pEVar1->_id != ArrayInitDataId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInitData]";
      goto LAB_00147d03;
    }
    goto LAB_00146ba8;
  case ArrayInitElemId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitArrayInitElem,currp);
    if (pEVar1->_id != ArrayInitElemId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInitElem]";
      goto LAB_00147d03;
    }
LAB_00146ba8:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
               (Expression **)&pEVar1[3].type);
LAB_00147594:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
LAB_001475a3:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
               (Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_00147881;
  case RefAsId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitRefAs,currp);
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_00147d03;
    }
    goto LAB_00147873;
  case StringNewId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitStringNew,currp);
    if (pEVar1->_id != StringNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
      goto LAB_00147d03;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer,wasm::Visitor<(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)((anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer,wasm::Visitor<(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer,void>>::Task,10ul>
                  *)&(self->super_PostWalker<InitFixer,_wasm::Visitor<InitFixer,_void>_>).
                     super_Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer,wasm::Visitor<(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)((anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer,wasm::Visitor<(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer,void>>::Task,10ul>
                  *)&(self->super_PostWalker<InitFixer,_wasm::Visitor<InitFixer,_void>_>).
                     super_Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    goto LAB_00147873;
  case StringConstId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitStringConst,currp);
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_00147d03;
    }
    break;
  case StringMeasureId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitStringMeasure,currp);
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_00147d03;
    }
LAB_00147873:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_00147881;
  case StringEncodeId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitStringEncode,currp);
    if (pEVar1->_id != StringEncodeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
      goto LAB_00147d03;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer,wasm::Visitor<(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer,void>>::Task,10ul>
      ::
      emplace_back<void(*&)((anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer,wasm::Visitor<(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer,void>>::Task,10ul>
                  *)&(self->super_PostWalker<InitFixer,_wasm::Visitor<InitFixer,_void>_>).
                     super_Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>.stack,&local_40,
                 (Expression ***)&local_38);
    }
    goto LAB_001474b7;
  case StringConcatId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitStringConcat,currp);
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_00147d03;
    }
    goto LAB_00147781;
  case StringEqId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitStringEq,currp);
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_00147d03;
    }
LAB_001474b7:
    currp_00 = pEVar1 + 2;
LAB_001474c2:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
               (Expression **)currp_00);
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_00147881;
  case StringWTF16GetId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitStringWTF16Get,currp);
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_00147d03;
    }
    goto LAB_00147781;
  case StringSliceWTFId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitStringSliceWTF,currp);
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_00147d03;
    }
LAB_00147772:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 2));
LAB_00147781:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_00147881;
  case ContNewId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitContNew,currp);
    if (pEVar1->_id != ContNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ContNew]";
      goto LAB_00147d03;
    }
LAB_00147318:
    pEVar1 = pEVar1 + 1;
LAB_00147881:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,(Expression **)pEVar1
              );
    return;
  case ContBindId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitContBind,currp);
    if (pEVar1->_id != ContBindId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ContBind]";
      goto LAB_00147d03;
    }
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[1].type.id <= uVar3 - 2) goto LAB_00147938;
        Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
                  ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case SuspendId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitSuspend,currp);
    if (pEVar1->_id != SuspendId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Suspend]";
      goto LAB_00147d03;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_00147938;
        Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
                  ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ResumeId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitResume,currp);
    if (pEVar1->_id != ResumeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Resume]";
      goto LAB_00147d03;
    }
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 7));
    uVar2 = (uint)pEVar1[5].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[5].type.id <= uVar3 - 2) goto LAB_00147938;
        Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
                  ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 5) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case ResumeThrowId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitResumeThrow,currp);
    if (pEVar1->_id != ResumeThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ResumeThrow]";
      goto LAB_00147d03;
    }
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 8));
    uVar2 = (uint)pEVar1[6].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[6].type.id <= uVar3 - 2) goto LAB_00147938;
        Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
                  ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 6) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    break;
  case StackSwitchId:
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,
               Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::doVisitStackSwitch,currp);
    if (pEVar1->_id != StackSwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StackSwitch]";
      goto LAB_00147d03;
    }
    Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
              ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 4));
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar4 = uVar3 * 8;
      uVar3 = uVar3 + 1;
      do {
        lVar4 = lVar4 + -8;
        if (pEVar1[2].type.id <= uVar3 - 2) goto LAB_00147938;
        Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_>::pushTask
                  ((Walker<InitFixer,_wasm::Visitor<InitFixer,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar4));
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }